

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O3

int consume_markers(j_decompress_ptr cinfo)

{
  jpeg_input_controller *pjVar1;
  jpeg_error_mgr *pjVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  
  pjVar1 = cinfo->inputctl;
  iVar3 = 2;
  if (pjVar1->eoi_reached == 0) {
    do {
      while( true ) {
        iVar3 = (*cinfo->marker->read_markers)(cinfo);
        if (iVar3 != 1) {
          if (iVar3 != 2) {
            return iVar3;
          }
          pjVar1->eoi_reached = 1;
          if (*(int *)&pjVar1[1].consume_input != 0) {
            if (cinfo->marker->saw_SOF == 0) {
              return 2;
            }
            pjVar2 = cinfo->err;
            pjVar2->msg_code = 0x3d;
            (*pjVar2->error_exit)((j_common_ptr)cinfo);
            return 2;
          }
          if (cinfo->output_scan_number <= cinfo->input_scan_number) {
            return 2;
          }
          cinfo->output_scan_number = cinfo->input_scan_number;
          return 2;
        }
        if (*(int *)&pjVar1[1].consume_input == 0) break;
        if (*(int *)&pjVar1[1].consume_input == 1) {
          if ((0xffdc < cinfo->image_height) || (0xffdc < cinfo->image_width)) {
            *(undefined8 *)&cinfo->err->msg_code = 0xffdc0000002a;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          iVar3 = cinfo->data_precision;
          if (iVar3 != 8) {
            pjVar2 = cinfo->err;
            pjVar2->msg_code = 0x10;
            (pjVar2->msg_parm).i[0] = iVar3;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          iVar3 = cinfo->num_components;
          if (10 < iVar3) {
            pjVar2 = cinfo->err;
            pjVar2->msg_code = 0x1b;
            (pjVar2->msg_parm).i[0] = iVar3;
            (cinfo->err->msg_parm).i[1] = 10;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            iVar3 = cinfo->num_components;
          }
          cinfo->max_h_samp_factor = 1;
          cinfo->max_v_samp_factor = 1;
          if (0 < iVar3) {
            piVar11 = &cinfo->comp_info->v_samp_factor;
            iVar8 = 0;
            iVar5 = 1;
            iVar6 = 1;
            do {
              iVar9 = piVar11[-1];
              if ((iVar9 - 5U < 0xfffffffc) || (iVar10 = *piVar11, iVar10 - 5U < 0xfffffffc)) {
                pjVar2 = cinfo->err;
                pjVar2->msg_code = 0x13;
                (*pjVar2->error_exit)((j_common_ptr)cinfo);
                iVar3 = cinfo->num_components;
                iVar6 = cinfo->max_h_samp_factor;
                iVar9 = piVar11[-1];
                iVar10 = *piVar11;
                iVar5 = cinfo->max_v_samp_factor;
              }
              if (iVar9 < iVar6) {
                iVar9 = iVar6;
              }
              cinfo->max_h_samp_factor = iVar9;
              if (iVar5 <= iVar10) {
                iVar5 = iVar10;
              }
              cinfo->max_v_samp_factor = iVar5;
              iVar8 = iVar8 + 1;
              piVar11 = piVar11 + 0x18;
              iVar6 = iVar9;
            } while (iVar8 < iVar3);
          }
          if ((cinfo->is_baseline == 0) &&
             ((cinfo->progressive_mode == 0 || (cinfo->comps_in_scan == 0)))) {
            iVar6 = cinfo->Se;
            if (iVar6 < 0x50) {
              if (iVar6 < 0x18) {
                if (iVar6 < 8) {
                  if (iVar6 == 0) {
                    cinfo->block_size = 1;
                    cinfo->natural_order = jpeg_natural_order;
                    cinfo->lim_Se = 0;
                    iVar6 = 1;
                  }
                  else {
                    if (iVar6 != 3) goto LAB_0027575c;
                    cinfo->block_size = 2;
                    cinfo->natural_order = jpeg_natural_order2;
                    cinfo->lim_Se = 3;
                    iVar6 = 2;
                  }
                }
                else if (iVar6 == 8) {
                  cinfo->block_size = 3;
                  cinfo->natural_order = jpeg_natural_order3;
                  cinfo->lim_Se = 8;
                  iVar6 = 3;
                }
                else {
                  if (iVar6 != 0xf) goto LAB_0027575c;
                  cinfo->block_size = 4;
                  cinfo->natural_order = jpeg_natural_order4;
                  cinfo->lim_Se = 0xf;
                  iVar6 = 4;
                }
              }
              else if (iVar6 < 0x30) {
                if (iVar6 == 0x18) {
                  cinfo->block_size = 5;
                  cinfo->natural_order = jpeg_natural_order5;
                  cinfo->lim_Se = 0x18;
                  iVar6 = 5;
                }
                else {
                  if (iVar6 != 0x23) goto LAB_0027575c;
                  cinfo->block_size = 6;
                  cinfo->natural_order = jpeg_natural_order6;
                  cinfo->lim_Se = 0x23;
                  iVar6 = 6;
                }
              }
              else if (iVar6 == 0x30) {
                cinfo->block_size = 7;
                cinfo->natural_order = jpeg_natural_order7;
                cinfo->lim_Se = 0x30;
                iVar6 = 7;
              }
              else {
                if (iVar6 == 0x3f) goto LAB_0027520e;
LAB_0027575c:
                pjVar2 = cinfo->err;
                pjVar2->msg_code = 0x11;
                (pjVar2->msg_parm).i[0] = cinfo->Ss;
                (cinfo->err->msg_parm).i[1] = cinfo->Se;
                (cinfo->err->msg_parm).i[2] = cinfo->Ah;
                (cinfo->err->msg_parm).i[3] = cinfo->Al;
                (*cinfo->err->error_exit)((j_common_ptr)cinfo);
                iVar3 = cinfo->num_components;
                iVar6 = cinfo->block_size;
              }
            }
            else if (iVar6 < 0xa8) {
              if (iVar6 < 0x78) {
                if (iVar6 == 0x50) {
                  cinfo->block_size = 9;
                  cinfo->natural_order = jpeg_natural_order;
                  cinfo->lim_Se = 0x3f;
                  iVar6 = 9;
                }
                else {
                  if (iVar6 != 99) goto LAB_0027575c;
                  cinfo->block_size = 10;
                  cinfo->natural_order = jpeg_natural_order;
                  cinfo->lim_Se = 0x3f;
                  iVar6 = 10;
                }
              }
              else if (iVar6 == 0x78) {
                cinfo->block_size = 0xb;
                cinfo->natural_order = jpeg_natural_order;
                cinfo->lim_Se = 0x3f;
                iVar6 = 0xb;
              }
              else {
                if (iVar6 != 0x8f) goto LAB_0027575c;
                cinfo->block_size = 0xc;
                cinfo->natural_order = jpeg_natural_order;
                cinfo->lim_Se = 0x3f;
                iVar6 = 0xc;
              }
            }
            else if (iVar6 < 0xe0) {
              if (iVar6 == 0xa8) {
                cinfo->block_size = 0xd;
                cinfo->natural_order = jpeg_natural_order;
                cinfo->lim_Se = 0x3f;
                iVar6 = 0xd;
              }
              else {
                if (iVar6 != 0xc3) goto LAB_0027575c;
                cinfo->block_size = 0xe;
                cinfo->natural_order = jpeg_natural_order;
                cinfo->lim_Se = 0x3f;
                iVar6 = 0xe;
              }
            }
            else if (iVar6 == 0xe0) {
              cinfo->block_size = 0xf;
              cinfo->natural_order = jpeg_natural_order;
              cinfo->lim_Se = 0x3f;
              iVar6 = 0xf;
            }
            else {
              if (iVar6 != 0xff) goto LAB_0027575c;
              cinfo->block_size = 0x10;
              cinfo->natural_order = jpeg_natural_order;
              cinfo->lim_Se = 0x3f;
              iVar6 = 0x10;
            }
          }
          else {
LAB_0027520e:
            cinfo->block_size = 8;
            cinfo->natural_order = jpeg_natural_order;
            cinfo->lim_Se = 0x3f;
            iVar6 = 8;
          }
          cinfo->min_DCT_h_scaled_size = iVar6;
          cinfo->min_DCT_v_scaled_size = iVar6;
          if (0 < iVar3) {
            piVar11 = &cinfo->comp_info->h_samp_factor;
            iVar3 = 0;
            do {
              iVar6 = cinfo->block_size;
              piVar11[7] = iVar6;
              piVar11[8] = iVar6;
              lVar4 = jdiv_round_up((long)*piVar11 * (ulong)cinfo->image_width,
                                    (long)cinfo->max_h_samp_factor * (long)iVar6);
              piVar11[5] = (JDIMENSION)lVar4;
              lVar4 = jdiv_round_up((long)piVar11[1] * (ulong)cinfo->image_height,
                                    (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
              piVar11[6] = (JDIMENSION)lVar4;
              lVar4 = jdiv_round_up((long)*piVar11 * (ulong)cinfo->image_width,
                                    (long)cinfo->max_h_samp_factor);
              piVar11[9] = (JDIMENSION)lVar4;
              lVar4 = jdiv_round_up((long)piVar11[1] * (ulong)cinfo->image_height,
                                    (long)cinfo->max_v_samp_factor);
              piVar11[10] = (JDIMENSION)lVar4;
              piVar11[0xb] = 1;
              *(JQUANT_TBL **)(piVar11 + 0x12) = (JQUANT_TBL *)0x0;
              iVar3 = iVar3 + 1;
              piVar11 = piVar11 + 0x18;
            } while (iVar3 < cinfo->num_components);
            iVar6 = cinfo->block_size;
          }
          lVar4 = jdiv_round_up((ulong)cinfo->image_height,
                                (long)iVar6 * (long)cinfo->max_v_samp_factor);
          cinfo->total_iMCU_rows = (JDIMENSION)lVar4;
          iVar3 = cinfo->comps_in_scan;
          uVar7 = 1;
          if (cinfo->num_components <= iVar3) {
            uVar7 = (uint)(cinfo->progressive_mode != 0);
          }
          cinfo->inputctl->has_multiple_scans = uVar7;
        }
        else {
          iVar3 = cinfo->comps_in_scan;
        }
        if (iVar3 != 0) {
          *(undefined4 *)&pjVar1[1].consume_input = 0;
          goto LAB_00275821;
        }
        *(undefined4 *)&pjVar1[1].consume_input = 2;
      }
      if (pjVar1->has_multiple_scans == 0) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x24;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
      }
    } while (cinfo->comps_in_scan == 0);
    start_input_pass(cinfo);
LAB_00275821:
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

METHODDEF(int)
consume_markers (j_decompress_ptr cinfo)
{
  my_inputctl_ptr inputctl = (my_inputctl_ptr) cinfo->inputctl;
  int val;

  if (inputctl->pub.eoi_reached) /* After hitting EOI, read no further */
    return JPEG_REACHED_EOI;

  for (;;) {			/* Loop to pass pseudo SOS marker */
    val = (*cinfo->marker->read_markers) (cinfo);

    switch (val) {
    case JPEG_REACHED_SOS:	/* Found SOS */
      if (inputctl->inheaders) { /* 1st SOS */
	if (inputctl->inheaders == 1)
	  initial_setup(cinfo);
	if (cinfo->comps_in_scan == 0) { /* pseudo SOS marker */
	  inputctl->inheaders = 2;
	  break;
	}
	inputctl->inheaders = 0;
	/* Note: start_input_pass must be called by jdmaster.c
	 * before any more input can be consumed.  jdapimin.c is
	 * responsible for enforcing this sequencing.
	 */
      } else {			/* 2nd or later SOS marker */
	if (! inputctl->pub.has_multiple_scans)
	  ERREXIT(cinfo, JERR_EOI_EXPECTED); /* Oops, I wasn't expecting this! */
	if (cinfo->comps_in_scan == 0) /* unexpected pseudo SOS marker */
	  break;
	start_input_pass(cinfo);
      }
      return val;
    case JPEG_REACHED_EOI:	/* Found EOI */
      inputctl->pub.eoi_reached = TRUE;
      if (inputctl->inheaders) { /* Tables-only datastream, apparently */
	if (cinfo->marker->saw_SOF)
	  ERREXIT(cinfo, JERR_SOF_NO_SOS);
      } else {
	/* Prevent infinite loop in coef ctlr's decompress_data routine
	 * if user set output_scan_number larger than number of scans.
	 */
	if (cinfo->output_scan_number > cinfo->input_scan_number)
	  cinfo->output_scan_number = cinfo->input_scan_number;
      }
      return val;
    case JPEG_SUSPENDED:
      return val;
    default:
      return val;
    }
  }
}